

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lazy_entry.hpp
# Opt level: O3

void __thiscall libtorrent::lazy_entry::swap(lazy_entry *this,lazy_entry *e)

{
  uint uVar1;
  uint32_t uVar2;
  data_t dVar3;
  char *pcVar4;
  uint uVar5;
  
  uVar1 = *(uint *)&e->field_0x14;
  *(uint *)&e->field_0x14 = uVar1 & 0x1fffffff | *(uint *)&this->field_0x14 & 0xe0000000;
  uVar5 = *(uint *)&this->field_0x14 & 0x1fffffff;
  *(uint *)&this->field_0x14 = uVar1 & 0xe0000000 | uVar5;
  uVar1 = *(uint *)&e->field_0x14;
  *(uint *)&e->field_0x14 = uVar1 & 0xe0000000 | uVar5;
  *(uint *)&this->field_0x14 = *(uint *)&this->field_0x14 & 0xe0000000 | uVar1 & 0x1fffffff;
  dVar3 = this->m_data;
  this->m_data = e->m_data;
  e->m_data = dVar3;
  pcVar4 = this->m_begin;
  this->m_begin = e->m_begin;
  e->m_begin = pcVar4;
  uVar2 = this->m_len;
  this->m_len = e->m_len;
  e->m_len = uVar2;
  return;
}

Assistant:

void swap(lazy_entry& e)
		{
			using std::swap;
			std::uint32_t tmp = e.m_type;
			e.m_type = m_type;
			m_type = tmp;
			tmp = e.m_size;
			e.m_size = m_size;
			m_size = tmp;
			swap(m_data.start, e.m_data.start);
			swap(m_begin, e.m_begin);
			swap(m_len, e.m_len);
		}